

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O2

EC_T_BOOL FindSlaveGetFixedAddr
                    (EC_T_DWORD dwInstanceID,CAtEmLogging *poLog,EC_T_DWORD dwSlaveInstance,
                    EC_T_DWORD dwVendorId,EC_T_DWORD dwProductCode,EC_T_WORD *pwPhysAddr)

{
  uint uVar1;
  uint uVar2;
  short sVar3;
  EC_T_DWORD EVar4;
  EC_T_BUS_SLAVE_INFO oBusSlaveInfo;
  
  sVar3 = 0;
  uVar2 = 0;
  EVar4 = 0;
  do {
    uVar1 = emGetNumConnectedSlaves(dwInstanceID);
    if (uVar1 <= uVar2) {
      return 0;
    }
    uVar1 = emGetBusSlaveInfo(dwInstanceID,0,sVar3,&oBusSlaveInfo);
    if (uVar1 == 0) {
      if ((oBusSlaveInfo.dwVendorId == dwVendorId) && (oBusSlaveInfo.dwProductCode == dwProductCode)
         ) {
        if (EVar4 == dwSlaveInstance) {
          *pwPhysAddr = oBusSlaveInfo.wStationAddress;
          return 1;
        }
        EVar4 = EVar4 + 1;
      }
    }
    else {
      CAtEmLogging::LogError
                (poLog,"PrintSlaveInfos() emGetBusSlaveInfo return with error 0x%x",(ulong)uVar1);
    }
    uVar2 = uVar2 + 1;
    sVar3 = sVar3 + -1;
  } while( true );
}

Assistant:

EC_T_BOOL FindSlaveGetFixedAddr
    (EC_T_DWORD     dwInstanceID
    ,CAtEmLogging*  poLog
    ,EC_T_DWORD     dwSlaveInstance     /**< [in]   Slave instance (0 = first matching, 1 = second, ...) */
    ,EC_T_DWORD     dwVendorId          /**< [in]   Vendor Id of slave to search */
    ,EC_T_DWORD     dwProductCode       /**< [in]   Product Code of slave to search */
    ,EC_T_WORD*     pwPhysAddr)         /**< [out]  Physical Address of slave */
{
EC_T_DWORD dwRes              = EC_E_ERROR;
EC_T_DWORD dwSlaveIdx         = 0;
EC_T_DWORD dwSlaveInstanceCnt = 0;

    for (dwSlaveIdx = 0; dwSlaveIdx < emGetNumConnectedSlaves(dwInstanceID); dwSlaveIdx++)
    {
    EC_T_WORD           wAutoIncAddress = (EC_T_WORD)(0-dwSlaveIdx);
    EC_T_BUS_SLAVE_INFO oBusSlaveInfo;

        /* get information about bus slave */
        dwRes = emGetBusSlaveInfo(dwInstanceID, EC_FALSE, wAutoIncAddress, &oBusSlaveInfo);
        if (EC_E_NOERROR != dwRes)
        {
            LogErr("PrintSlaveInfos() emGetBusSlaveInfo return with error 0x%x", dwRes);
            continue;
        }
        if ((oBusSlaveInfo.dwVendorId == dwVendorId) && (oBusSlaveInfo.dwProductCode == dwProductCode))
        {
            if (dwSlaveInstanceCnt == dwSlaveInstance)
            {
                /* slave found */
                *pwPhysAddr = oBusSlaveInfo.wStationAddress;
                return EC_TRUE;
            }
            dwSlaveInstanceCnt++;
        }
    }
    return EC_FALSE;
}